

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceDirectional::~IfcLightSourceDirectional
          (IfcLightSourceDirectional *this)

{
  ~IfcLightSourceDirectional
            ((IfcLightSourceDirectional *)
             &this[-1].super_IfcLightSource.super_IfcGeometricRepresentationItem.field_0x30);
  return;
}

Assistant:

IfcLightSourceDirectional() : Object("IfcLightSourceDirectional") {}